

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

String * __thiscall
doctest::detail::
stringifyBinaryExpr<boost::iterator_range<burst::difference_iterator<std::_List_const_iterator<char>,std::_List_const_iterator<char>,std::greater<void>>>,std::__cxx11::list<char,std::allocator<char>>>
          (String *__return_storage_ptr__,detail *this,
          iterator_range<burst::difference_iterator<std::_List_const_iterator<char>,_std::_List_const_iterator<char>,_std::greater<void>_>_>
          *lhs,char *op,list<char,_std::allocator<char>_> *rhs)

{
  ostream *stream;
  String SStack_78;
  String local_60;
  String local_48;
  String local_30;
  
  stream = tlssPush();
  filldata<boost::iterator_range<burst::difference_iterator<std::_List_const_iterator<char>,_std::_List_const_iterator<char>,_std::greater<void>_>_>_>
  ::fill(stream,(iterator_range<burst::difference_iterator<std::_List_const_iterator<char>,_std::_List_const_iterator<char>,_std::greater<void>_>_>
                 *)this);
  tlssPop();
  String::String(&local_60,(char *)lhs);
  operator+(&local_30,&local_48,&local_60);
  String::String(&SStack_78,"{?}");
  operator+(__return_storage_ptr__,&local_30,&SStack_78);
  String::~String(&SStack_78);
  String::~String(&local_30);
  String::~String(&local_60);
  String::~String(&local_48);
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        return (DOCTEST_STRINGIFY(lhs)) + op + (DOCTEST_STRINGIFY(rhs));
    }